

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpvector.hpp
# Opt level: O0

void __thiscall QpVector::resparsify(QpVector *this)

{
  int iVar1;
  reference pvVar2;
  reference pvVar3;
  int *in_RDI;
  HighsInt i;
  int local_c;
  
  *in_RDI = 0;
  for (local_c = 0; local_c < in_RDI[1]; local_c = local_c + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_c);
    if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
      iVar1 = *in_RDI;
      *in_RDI = iVar1 + 1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)iVar1);
      *pvVar3 = local_c;
    }
  }
  return;
}

Assistant:

void resparsify() {
    num_nz = 0;
    for (HighsInt i = 0; i < dim; i++) {
      if (value[i] != 0.0) {
        index[num_nz++] = i;
      }
    }
  }